

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
fmt::v7::detail::
format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
::on_format_specs(format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *this,int id,char *begin,char *end)

{
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> *ctx;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *this_00;
  undefined1 value [16];
  undefined1 value_00 [16];
  handle handle;
  basic_string_view<char> value_01;
  char *pcVar1;
  char *p;
  error_handler *this_01;
  unkbyte10 in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff22;
  specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
  local_d0;
  char *local_a8;
  error_handler *local_a0;
  undefined1 local_98 [8];
  basic_format_specs<char> specs;
  undefined1 auStack_58 [8];
  format_arg arg;
  
  ctx = &this->parse_context;
  local_a8 = end;
  local_a0 = (error_handler *)begin;
  advance_to<char,fmt::v7::detail::error_handler>(ctx,begin);
  this_00 = &this->context;
  get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
            ((format_arg *)auStack_58,(detail *)this_00,
             (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)(ulong)(uint)id,
             (int)end);
  pcVar1 = local_a8;
  if (arg.value_.field_0.int128_value._8_4_ == 0xf) {
    (*(code *)CONCAT62(arg.value_.field_0.long_long_value._2_6_,arg.value_.field_0.int_value._0_2_))
              (CONCAT44(auStack_58._4_4_,auStack_58._0_4_),ctx,this_00);
    p = (ctx->format_str_).data_;
  }
  else {
    local_d0.
    super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .super_specs_setter<char>.specs_ = (basic_format_specs<char> *)local_98;
    local_98._0_4_ = 0;
    local_98._4_4_ = -1;
    specs.width._0_2_ = 0;
    specs.precision._2_1_ = 1;
    specs._2_4_ = 0x20;
    local_d0.checker_.error_handler_ =
         &local_d0.
          super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ;
    local_d0.checker_.arg_type_ = arg.value_.field_0.int128_value._8_4_;
    this_01 = local_a0;
    local_d0.
    super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .parse_context_ = ctx;
    local_d0.
    super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .context_ = this_00;
    p = parse_format_specs<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                  ((char *)local_a0,local_a8,
                   (specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
                    *)local_d0.checker_.error_handler_);
    if ((p == pcVar1) || (*p != '}')) {
      error_handler::on_error(this_01,"missing \'}\' in format string");
    }
    advance_to<char,fmt::v7::detail::error_handler>(ctx,p);
    specs._8_8_ = (this->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                  container;
    switch(arg.value_.field_0.int128_value._8_4_) {
    case 1:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<int>((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                        *)&specs.type,auStack_58._0_4_,(format_specs *)local_98);
      break;
    case 2:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<unsigned_int>
                ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                  *)&specs.type,auStack_58._0_4_,(format_specs *)local_98);
      break;
    case 3:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<long_long>
                ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                  *)&specs.type,CONCAT44(auStack_58._4_4_,auStack_58._0_4_),(format_specs *)local_98
                );
      break;
    case 4:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<unsigned_long_long>
                ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                  *)&specs.type,CONCAT44(auStack_58._4_4_,auStack_58._0_4_),(format_specs *)local_98
                );
      break;
    case 5:
      value._10_6_ = in_stack_ffffffffffffff22;
      value._0_10_ = in_stack_ffffffffffffff18;
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<__int128>
                ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                  *)&specs.type,(__int128)value,
                 (format_specs *)CONCAT44(auStack_58._4_4_,auStack_58._0_4_));
      break;
    case 6:
      value_00._10_6_ = in_stack_ffffffffffffff22;
      value_00._0_10_ = in_stack_ffffffffffffff18;
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>
      ::write_int<unsigned__int128>
                ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>
                  *)&specs.type,(unsigned___int128)value_00,
                 (format_specs *)CONCAT44(auStack_58._4_4_,auStack_58._0_4_));
      break;
    case 7:
      specs._8_8_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                    ::operator()((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                                  *)&specs.type,(bool)auStack_58[0]);
      break;
    case 8:
      specs._8_8_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                    ::operator()((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                                  *)&specs.type,auStack_58[0]);
      break;
    case 9:
      specs._8_8_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                    ::operator()<float,_0>
                              ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                                *)&specs.type,(float)auStack_58._0_4_);
      break;
    case 10:
      specs._8_8_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                    ::operator()<double,_0>
                              ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                                *)&specs.type,(double)CONCAT44(auStack_58._4_4_,auStack_58._0_4_));
      break;
    case 0xb:
      specs._8_8_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                    ::operator()<long_double,_0>
                              ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                                *)&specs.type,
                               (longdouble)
                               CONCAT28(arg.value_.field_0.int_value._0_2_,
                                        CONCAT44(auStack_58._4_4_,auStack_58._0_4_)));
      break;
    case 0xc:
      specs._8_8_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                    ::operator()((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                                  *)&specs.type,(char *)CONCAT44(auStack_58._4_4_,auStack_58._0_4_))
      ;
      break;
    case 0xd:
      value_01.data_._4_4_ = auStack_58._4_4_;
      value_01.data_._0_4_ = auStack_58._0_4_;
      value_01.size_._0_2_ = arg.value_.field_0.int_value._0_2_;
      value_01.size_._2_6_ = arg.value_.field_0.long_long_value._2_6_;
      specs._8_8_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                    ::operator()((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                                  *)&specs.type,value_01);
      break;
    case 0xe:
      specs._8_8_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                    ::operator()((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                                  *)&specs.type,(void *)CONCAT44(auStack_58._4_4_,auStack_58._0_4_))
      ;
      break;
    case 0xf:
      handle.custom_.value._4_4_ = auStack_58._4_4_;
      handle.custom_.value._0_4_ = auStack_58._0_4_;
      handle.custom_.format._0_2_ = arg.value_.field_0.int_value._0_2_;
      handle.custom_.format._2_6_ = arg.value_.field_0.long_long_value._2_6_;
      specs._8_8_ = arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
                              ((arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *)
                               &specs.type,handle);
      break;
    default:
      specs._8_8_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                    ::operator()((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                                  *)&specs.type);
    }
    (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (buffer<char> *)specs._8_8_;
  }
  return p;
}

Assistant:

const Char* on_format_specs(int id, const Char* begin, const Char* end) {
    advance_to(parse_context, begin);
    auto arg = get_arg(context, id);
    custom_formatter<Context> f(parse_context, context);
    if (visit_format_arg(f, arg)) return parse_context.begin();
    basic_format_specs<Char> specs;
    using parse_context_t = basic_format_parse_context<Char>;
    specs_checker<specs_handler<parse_context_t, Context>> handler(
        specs_handler<parse_context_t, Context>(specs, parse_context, context),
        arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}') on_error("missing '}' in format string");
    advance_to(parse_context, begin);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context, &specs), arg));
    return begin;
  }